

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

size_t zng_gzfwrite(void *buf,size_t size,size_t nitems,gzFile file)

{
  char *msg;
  size_t sVar1;
  gz_state *in_RCX;
  gz_state *in_RDX;
  ulong in_RSI;
  gz_state *state;
  size_t len;
  ulong local_40;
  ulong local_8;
  
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else if (in_RCX == (gz_state *)0x0) {
    local_8 = 0;
  }
  else if ((in_RCX->mode == 0x79b1) && (in_RCX->err == 0)) {
    msg = (char *)((long)in_RDX * in_RSI);
    if ((gz_state *)((ulong)msg / in_RSI) == in_RDX) {
      if (msg == (char *)0x0) {
        local_40 = 0;
      }
      else {
        sVar1 = gz_write(in_RCX,msg,(size_t)in_RCX);
        local_40 = sVar1 / in_RSI;
      }
      local_8 = local_40;
    }
    else {
      gz_error(in_RDX,(int)((ulong)in_RCX >> 0x20),msg);
      local_8 = 0;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t Z_EXPORT PREFIX(gzfwrite)(void const *buf, size_t size, size_t nitems, gzFile file) {
    size_t len;
    gz_state *state;

    /* Exit early if size is zero, also prevents potential division by zero */
    if (size == 0)
        return 0;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_state *)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* compute bytes to read -- error on overflow */
    len = nitems * size;
    if (len / size != nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }

    /* write len bytes to buf, return the number of full items written */
    return len ? gz_write(state, buf, len) / size : 0;
}